

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::PrintWithFallback<unsigned_long>(unsigned_long *value,ostream *os)

{
  unsigned_long *in_RSI;
  ostream *in_stack_ffffffffffffffe8;
  
  internal_stream_operator_without_lexical_name_lookup::StreamPrinter::
  PrintValue<unsigned_long,void,std::ostream&>(in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

void PrintWithFallback(const T& value, ::std::ostream* os) {
  using Printer = typename FindFirstPrinter<
      T, void, ContainerPrinter, FunctionPointerPrinter, PointerPrinter,
      internal_stream_operator_without_lexical_name_lookup::StreamPrinter,
      ProtobufPrinter, ConvertibleToIntegerPrinter,
      ConvertibleToStringViewPrinter, RawBytesPrinter, FallbackPrinter>::type;
  Printer::PrintValue(value, os);
}